

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

DropoutParameter * __thiscall caffe::LayerParameter::mutable_dropout_param(LayerParameter *this)

{
  DropoutParameter *this_00;
  LayerParameter *this_local;
  
  set_has_dropout_param(this);
  if (this->dropout_param_ == (DropoutParameter *)0x0) {
    this_00 = (DropoutParameter *)operator_new(0x20);
    DropoutParameter::DropoutParameter(this_00);
    this->dropout_param_ = this_00;
  }
  return this->dropout_param_;
}

Assistant:

inline ::caffe::DropoutParameter* LayerParameter::mutable_dropout_param() {
  set_has_dropout_param();
  if (dropout_param_ == NULL) {
    dropout_param_ = new ::caffe::DropoutParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.LayerParameter.dropout_param)
  return dropout_param_;
}